

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<Job*,std::__cxx11::string_const&>::load_impl_sequence<0ul,1ul>
          (argument_loader<Job*,std::__cxx11::string_const&> *this,PyObject *src)

{
  int iVar1;
  type_caster_generic *this_00;
  PyObject **ppPVar2;
  __tuple_element_t<1UL,_tuple<type_caster<Job,_void>,_type_caster<std::string>_>_> *this_01;
  const_iterator pbVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  handle local_50;
  bool local_42;
  undefined1 local_41;
  initializer_list<bool> local_40;
  initializer_list<bool> *local_30;
  initializer_list<bool> *__range3;
  argument_loader<Job_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  handle local_18;
  handle src_local;
  
  __range3 = (initializer_list<bool> *)this;
  local_18.m_ptr = src;
  this_00 = (type_caster_generic *)
            std::
            get<0ul,pybind11::detail::type_caster<Job,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<pybind11::detail::type_caster<Job,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 == 0) {
    __assert_fail("PyTuple_Check(src.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                  ,0x4f5,
                  "bool pybind11::detail::argument_loader<Job *, const std::basic_string<char> &>::load_impl_sequence(handle, index_sequence<Is...>) [Args = <Job *, const std::basic_string<char> &>, Is = <0UL, 1UL>]"
                 );
  }
  ppPVar2 = handle::ptr(&local_18);
  handle::handle(&local_50,(PyObject *)(*ppPVar2)[1].ob_type);
  local_42 = type_caster_generic::load(this_00,local_50,true);
  this_01 = std::
            get<1ul,pybind11::detail::type_caster<Job,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                      ((tuple<pybind11::detail::type_caster<Job,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 != 0) {
    ppPVar2 = handle::ptr(&local_18);
    handle::handle((handle *)&__begin0,(PyObject *)(*ppPVar2)[2].ob_refcnt);
    local_41 = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               ::load(this_01,(handle)__begin0,true);
    local_40._M_array = &local_42;
    local_40._M_len = 2;
    local_30 = &local_40;
    __end0 = std::initializer_list<bool>::begin(local_30);
    pbVar3 = std::initializer_list<bool>::end(local_30);
    while( true ) {
      if (__end0 == pbVar3) {
        return true;
      }
      if ((*__end0 & 1U) == 0) break;
      __end0 = __end0 + 1;
    }
    return false;
  }
  __assert_fail("PyTuple_Check(src.ptr())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                ,0x4f5,
                "bool pybind11::detail::argument_loader<Job *, const std::basic_string<char> &>::load_impl_sequence(handle, index_sequence<Is...>) [Args = <Job *, const std::basic_string<char> &>, Is = <0UL, 1UL>]"
               );
}

Assistant:

bool load_impl_sequence(handle src, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(value).load(PyTuple_GET_ITEM(src.ptr(), Is), true)...})
            if (!r)
                return false;
        return true;
    }